

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O1

void __thiscall
StringWriter_ReadMaxTwoByteLengthCharString_Test::~StringWriter_ReadMaxTwoByteLengthCharString_Test
          (StringWriter_ReadMaxTwoByteLengthCharString_Test *this)

{
  pointer puVar1;
  
  (this->super_StringWriter).super_Test._vptr_Test = (_func_int **)&PTR__StringWriter_00197180;
  pstore::serialize::archive::vector_writer::~vector_writer(&(this->super_StringWriter).writer_);
  puVar1 = (this->super_StringWriter).bytes_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_StringWriter).bytes_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F (StringWriter, ReadMaxTwoByteLengthCharString) {
    auto const src_length = three_byte_varint - 1;
    auto const src_char = 'a';

    // Produce a serialized string of 'length' character 'a's.
    {
        auto output_it = std::back_inserter (bytes_);
        pstore::varint::encode (src_length, output_it);
        std::generate_n (output_it, src_length,
                         [src_char] () { return static_cast<std::uint8_t> (src_char); });
    }

    auto archive = pstore::serialize::archive::make_reader (std::begin (writer_));
    std::string const actual = pstore::serialize::read<std::string> (archive);
    std::string const expected (src_length, src_char);
    EXPECT_EQ (expected, actual);
    EXPECT_EQ (std::end (writer_), archive.iterator ());
}